

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O3

UniformCollection *
deqp::gles3::Functional::anon_unknown_1::UniformCollection::basic(DataType type,char *nameSuffix)

{
  UniformCollection *this;
  long *plVar1;
  long *plVar2;
  long *name_;
  long *local_c0 [2];
  long local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  VarType local_80;
  Uniform local_68;
  
  this = (UniformCollection *)operator_new(0x30);
  (this->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"u_var","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_c0);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_90 = *plVar2;
    lStack_88 = plVar1[3];
    name_ = &local_90;
  }
  else {
    local_90 = *plVar2;
    name_ = (long *)*plVar1;
  }
  local_98 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_a0 = name_;
  glu::VarType::VarType(&local_80,type,(uint)(type - TYPE_BOOL < 4) * 2 + PRECISION_MEDIUMP);
  Uniform::Uniform(&local_68,(char *)name_,&local_80);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
               *)this,&local_68);
  glu::VarType::~VarType(&local_68.type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != &local_68.name.field_2) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_80);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  return this;
}

Assistant:

static UniformCollection* basic (const glu::DataType type, const char* const nameSuffix = "")
	{
		UniformCollection* const	res		= new UniformCollection;
		const glu::Precision		prec	= glu::isDataTypeBoolOrBVec(type) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		res->m_uniforms.push_back(Uniform((string("u_var") + nameSuffix).c_str(), glu::VarType(type, prec)));
		return res;
	}